

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close.c
# Opt level: O0

int run_test_tcp_close(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  int r;
  uv_loop_t *loop;
  uv_tcp_t tcp_server;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&tcp_server.queued_fds);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close.c"
            ,0x6b,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  puVar2 = (uv_loop_t *)uv_default_loop();
  start_server(puVar2,(uv_tcp_t *)&loop);
  iVar1 = uv_tcp_init(puVar2,&tcp_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close.c"
            ,0x73,"r == 0");
    abort();
  }
  iVar1 = uv_tcp_connect(&connect_req,&tcp_handle,&tcp_server.queued_fds,connect_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close.c"
            ,0x79,"r == 0");
    abort();
  }
  if (write_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close.c"
            ,0x7b,"write_cb_called == 0");
    abort();
  }
  if (close_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close.c"
            ,0x7c,"close_cb_called == 0");
    abort();
  }
  iVar1 = uv_run(puVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close.c"
            ,0x7f,"r == 0");
    abort();
  }
  printf("%d of %d write reqs seen\n",(ulong)(uint)write_cb_called,0x20);
  if (write_cb_called != 0x20) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close.c"
            ,0x83,"write_cb_called == NUM_WRITE_REQS");
    abort();
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close.c"
            ,0x84,"close_cb_called == 1");
    abort();
  }
  puVar2 = (uv_loop_t *)uv_default_loop();
  close_loop(puVar2);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close.c"
            ,0x86,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(tcp_close) {
  struct sockaddr_in addr;
  uv_tcp_t tcp_server;
  uv_loop_t* loop;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  loop = uv_default_loop();

  /* We can't use the echo server, it doesn't handle ECONNRESET. */
  start_server(loop, &tcp_server);

  r = uv_tcp_init(loop, &tcp_handle);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  ASSERT(write_cb_called == 0);
  ASSERT(close_cb_called == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  printf("%d of %d write reqs seen\n", write_cb_called, NUM_WRITE_REQS);

  ASSERT(write_cb_called == NUM_WRITE_REQS);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}